

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesNH4
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  long lVar1;
  ulong uVar2;
  ulong *puVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  uint32_t *puVar10;
  BrotliEncoderDictionary *pBVar11;
  HasherCommon *pHVar12;
  BrotliDictionary *pBVar13;
  int iVar14;
  ulong uVar15;
  ushort uVar16;
  uint uVar17;
  ushort uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  uint8_t *puVar23;
  long lVar24;
  ulong *puVar25;
  byte bVar26;
  uint8_t *puVar27;
  size_t sVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  int iVar32;
  long lVar33;
  uint32_t uVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  uint8_t uVar42;
  uint8_t *s1_orig_1;
  long lVar43;
  ulong uVar44;
  int iVar45;
  ulong uVar46;
  ulong uVar47;
  uint8_t *s1_orig;
  ulong uVar48;
  ulong *puVar49;
  long lVar50;
  ulong local_188;
  ulong local_178;
  uint local_16c;
  ulong local_158;
  Command *local_140;
  ulong local_120;
  int local_10c;
  ulong local_f8;
  ulong local_e8;
  ulong auStack_58 [5];
  
  uVar6 = (position - 7) + num_bytes;
  sVar28 = position;
  if (7 < num_bytes) {
    sVar28 = uVar6;
  }
  lVar43 = 0x200;
  if (params->quality < 9) {
    lVar43 = 0x40;
  }
  uVar46 = *last_insert_len;
  uVar2 = position + num_bytes;
  if (uVar2 <= position + 8) {
    local_140 = commands;
LAB_01be90f2:
    *last_insert_len = (uVar46 + uVar2) - position;
    *num_commands = *num_commands + ((long)local_140 - (long)commands >> 4);
    return;
  }
  uVar48 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  sVar8 = params->stream_offset;
  sVar9 = (params->dictionary).compound.total_size;
  local_120 = lVar43 + position;
  puVar10 = (hasher->privat)._H2.buckets_;
  uVar17 = (uint)ringbuffer_mask;
  lVar1 = sVar9 + 1;
  lVar5 = position - 1;
  local_140 = commands;
  uVar37 = position;
LAB_01be812b:
  uVar36 = uVar48;
  if (uVar37 < uVar48) {
    uVar36 = uVar37;
  }
  uVar44 = sVar8 + uVar37;
  if (uVar48 <= sVar8 + uVar37) {
    uVar44 = uVar48;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_16c = 0;
    local_e8 = 0;
  }
  else {
    if (uVar37 == 0) {
      local_e8 = 0;
LAB_01be8189:
      uVar21 = 0;
    }
    else {
      local_e8 = (ulong)ringbuffer[uVar37 - 1 & ringbuffer_mask];
      if (uVar37 == 1) goto LAB_01be8189;
      uVar21 = (ulong)ringbuffer[uVar37 - 2 & ringbuffer_mask];
    }
    local_16c = (uint)(params->dictionary).contextual.context_map
                      [literal_context_lut[uVar21 + 0x100] | literal_context_lut[local_e8]];
  }
  uVar47 = uVar2 - uVar37;
  pBVar11 = (params->dictionary).contextual.dict[local_16c];
  uVar21 = (params->dist).max_distance;
  uVar22 = uVar37 & ringbuffer_mask;
  puVar3 = (ulong *)(ringbuffer + uVar22);
  uVar42 = ringbuffer[uVar22];
  local_158 = (ulong)*dist_cache;
  uVar41 = 0x7e4;
  if ((uVar37 - local_158 < uVar37) &&
     (uVar19 = (uint)(uVar37 - local_158) & uVar17, uVar42 == ringbuffer[uVar19])) {
    puVar23 = ringbuffer + uVar19;
    puVar27 = puVar23;
    uVar39 = uVar47;
    puVar49 = puVar3;
    if (7 < uVar47) {
      lVar33 = 0;
      lVar38 = 0;
LAB_01be823e:
      if (*(ulong *)((long)puVar3 + lVar33) == *(ulong *)(puVar23 + lVar33)) goto code_r0x01be824b;
      uVar29 = *(ulong *)(puVar23 + lVar33) ^ *(ulong *)((long)puVar3 + lVar33);
      uVar39 = 0;
      if (uVar29 != 0) {
        for (; (uVar29 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
        }
      }
      uVar39 = (uVar39 >> 3 & 0x1fffffff) - lVar38;
      goto LAB_01be82bb;
    }
    goto LAB_01be8275;
  }
  goto LAB_01be82e4;
code_r0x01be824b:
  lVar33 = lVar33 + 8;
  lVar24 = lVar38 + uVar47;
  lVar38 = lVar38 + -8;
  if (lVar24 - 8U < 8) goto code_r0x01be8261;
  goto LAB_01be823e;
code_r0x01be8261:
  puVar27 = puVar23 + -lVar38;
  puVar49 = (ulong *)((long)puVar3 - lVar38);
  uVar39 = lVar38 + uVar47;
LAB_01be8275:
  if (uVar39 != 0) {
    uVar29 = 0;
    do {
      uVar30 = uVar29;
      if (puVar27[uVar29] != *(uint8_t *)((long)puVar49 + uVar29)) break;
      uVar29 = uVar29 + 1;
      uVar30 = uVar39;
    } while (uVar39 != uVar29);
    puVar27 = puVar27 + uVar30;
  }
  uVar39 = (long)puVar27 - (long)puVar23;
LAB_01be82bb:
  if ((uVar39 < 4) || (uVar29 = uVar39 * 0x87 + 0x78f, uVar29 < 0x7e5)) {
LAB_01be82e4:
    local_158 = 0;
    uVar39 = 0;
  }
  else {
    uVar42 = *(uint8_t *)((long)puVar3 + uVar39);
    uVar41 = uVar29;
  }
  uVar19 = (uint)((ulong)(*(long *)(ringbuffer + uVar22) * 0x7bd3579bd3000000) >> 0x2f);
  lVar24 = 0;
  lVar33 = 0;
  lVar38 = 1;
  do {
    auStack_58[lVar24] = lVar33 * 8 + (ulong)uVar19 & 0x1ffff;
    auStack_58[lVar24 + 1] = lVar38 * 8 + (ulong)uVar19 & 0x1ffff;
    lVar24 = lVar24 + 2;
    lVar33 = lVar33 + 2;
    lVar38 = lVar38 + 2;
  } while (lVar24 != 4);
  uVar19 = (uint)uVar37;
  lVar33 = *(long *)((long)auStack_58 + (ulong)(uVar19 & 0x18));
  lVar38 = 0;
LAB_01be8349:
  uVar20 = puVar10[auStack_58[lVar38]];
  puVar27 = ringbuffer + (uVar17 & uVar20);
  if (((uVar42 == puVar27[uVar39]) && (uVar37 != uVar20)) &&
     (uVar22 = uVar37 - uVar20, uVar22 <= uVar36)) {
    puVar23 = puVar27;
    uVar29 = uVar47;
    puVar49 = puVar3;
    if (7 < uVar47) {
      lVar24 = 0;
      lVar40 = 0;
LAB_01be8394:
      if (*(ulong *)((long)puVar3 + lVar24) == *(ulong *)(puVar27 + lVar24)) goto code_r0x01be83a2;
      uVar30 = *(ulong *)(puVar27 + lVar24) ^ *(ulong *)((long)puVar3 + lVar24);
      uVar29 = 0;
      if (uVar30 != 0) {
        for (; (uVar30 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
        }
      }
      uVar29 = (uVar29 >> 3 & 0x1fffffff) - lVar40;
      goto LAB_01be8418;
    }
    goto LAB_01be83cc;
  }
  goto LAB_01be844f;
code_r0x01be83a2:
  lVar24 = lVar24 + 8;
  lVar50 = lVar40 + uVar47;
  lVar40 = lVar40 + -8;
  if (lVar50 - 8U < 8) goto code_r0x01be83b8;
  goto LAB_01be8394;
code_r0x01be83b8:
  puVar23 = puVar27 + -lVar40;
  puVar49 = (ulong *)((long)puVar3 - lVar40);
  uVar29 = lVar40 + uVar47;
LAB_01be83cc:
  if (uVar29 != 0) {
    uVar30 = 0;
    do {
      uVar31 = uVar30;
      if (puVar23[uVar30] != *(uint8_t *)((long)puVar49 + uVar30)) break;
      uVar30 = uVar30 + 1;
      uVar31 = uVar29;
    } while (uVar29 != uVar30);
    puVar23 = puVar23 + uVar31;
  }
  uVar29 = (long)puVar23 - (long)puVar27;
LAB_01be8418:
  if (3 < uVar29) {
    iVar45 = 0x1f;
    if ((uint)uVar22 != 0) {
      for (; (uint)uVar22 >> iVar45 == 0; iVar45 = iVar45 + -1) {
      }
    }
    uVar30 = (ulong)(iVar45 * -0x1e + 0x780) + uVar29 * 0x87;
    if (uVar41 < uVar30) {
      uVar42 = *(uint8_t *)((long)puVar3 + uVar29);
      uVar41 = uVar30;
      uVar39 = uVar29;
      local_158 = uVar22;
    }
  }
LAB_01be844f:
  lVar38 = lVar38 + 1;
  if (lVar38 == 4) goto code_r0x01be845c;
  goto LAB_01be8349;
code_r0x01be845c:
  iVar45 = 0;
  if (uVar41 == 0x7e4) {
    pHVar12 = (hasher->privat)._H2.common;
    if (pHVar12->dict_num_lookups >> 7 <= pHVar12->dict_num_matches) {
      uVar36 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x12);
      puVar27 = pBVar11->hash_table_lengths;
      pHVar12->dict_num_lookups = pHVar12->dict_num_lookups + 1;
      bVar26 = puVar27[uVar36 * 2];
      uVar41 = (ulong)bVar26;
      if ((uVar41 != 0) && (uVar41 <= uVar47)) {
        pBVar13 = pBVar11->words;
        puVar25 = (ulong *)(pBVar13->data +
                           (ulong)pBVar13->offsets_by_length[uVar41] +
                           pBVar11->hash_table_words[uVar36 * 2] * uVar41);
        uVar22 = uVar41;
        puVar49 = puVar3;
        if (7 < bVar26) {
          lVar38 = 0;
LAB_01be8500:
          if (*puVar25 == *puVar49) goto code_r0x01be850b;
          uVar39 = *puVar49 ^ *puVar25;
          uVar22 = 0;
          if (uVar39 != 0) {
            for (; (uVar39 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
            }
          }
          uVar39 = (uVar22 >> 3 & 0x1fffffff) - lVar38;
          goto LAB_01be8586;
        }
        goto LAB_01be8532;
      }
    }
    goto LAB_01be84b8;
  }
LAB_01be8627:
  puVar10[lVar33] = uVar19;
  if (0x7e4 < uVar41) {
    iVar7 = *dist_cache;
    lVar33 = (lVar5 + num_bytes) - uVar37;
    local_10c = 0;
    uVar36 = uVar46;
    local_120 = uVar41;
LAB_01be8688:
    uVar47 = uVar47 - 1;
    uVar44 = uVar39 - 1;
    if (uVar47 <= uVar39 - 1) {
      uVar44 = uVar47;
    }
    if (4 < params->quality) {
      uVar44 = 0;
    }
    uVar41 = uVar37 + 1;
    uVar22 = uVar48;
    if (uVar41 < uVar48) {
      uVar22 = uVar41;
    }
    local_f8 = sVar8 + uVar37 + 1;
    if (uVar48 <= local_f8) {
      local_f8 = uVar48;
    }
    if ((params->dictionary).contextual.context_based != 0) {
      local_16c = (uint)(params->dictionary).contextual.context_map
                        [literal_context_lut[local_e8 + 0x100] |
                         literal_context_lut[ringbuffer[uVar37 & ringbuffer_mask]]];
      local_e8 = (ulong)ringbuffer[uVar37 & ringbuffer_mask];
    }
    puVar3 = (ulong *)(ringbuffer + (uVar41 & ringbuffer_mask));
    uVar42 = *(uint8_t *)(uVar44 + (long)puVar3);
    uVar29 = uVar41 - (long)iVar7;
    local_188 = 0x7e4;
    if ((uVar41 <= uVar29) ||
       (puVar27 = ringbuffer + ((uint)uVar29 & uVar17), uVar42 != puVar27[uVar44])) {
      local_178 = 0;
      goto LAB_01be884d;
    }
    puVar23 = puVar27;
    uVar29 = uVar47;
    puVar49 = puVar3;
    if (7 < uVar47) {
      lVar38 = 0;
      lVar24 = 0;
LAB_01be8773:
      if (*(ulong *)((long)puVar3 + lVar38) == *(ulong *)(puVar27 + lVar38)) goto code_r0x01be8780;
      uVar30 = *(ulong *)(puVar27 + lVar38) ^ *(ulong *)((long)puVar3 + lVar38);
      uVar29 = 0;
      if (uVar30 != 0) {
        for (; (uVar30 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
        }
      }
      uVar29 = (uVar29 >> 3 & 0x1fffffff) - lVar24;
      goto LAB_01be8807;
    }
    goto LAB_01be87aa;
  }
  goto LAB_01be8c52;
code_r0x01be850b:
  puVar25 = puVar25 + 1;
  puVar49 = puVar49 + 1;
  lVar24 = uVar41 + lVar38;
  lVar38 = lVar38 + -8;
  if (lVar24 - 8U < 8) goto code_r0x01be8525;
  goto LAB_01be8500;
code_r0x01be8525:
  uVar22 = lVar38 + uVar41;
  if (lVar38 + uVar41 != 0) {
LAB_01be8532:
    uVar39 = 0;
    do {
      uVar29 = uVar39;
      if (*(char *)((long)puVar49 + uVar39) != *(char *)((long)puVar25 + uVar39)) break;
      uVar39 = uVar39 + 1;
      uVar29 = uVar22;
    } while (uVar22 != uVar39);
    puVar49 = (ulong *)((long)puVar49 + uVar29);
  }
  uVar39 = (long)puVar49 - (long)puVar3;
LAB_01be8586:
  if (((uVar39 != 0) && (uVar41 < pBVar11->cutoffTransformsCount + uVar39)) &&
     (local_158 = uVar44 + lVar1 + (ulong)pBVar11->hash_table_words[uVar36 * 2] +
                  ((ulong)((uint)(pBVar11->cutoffTransforms >>
                                 ((char)(uVar41 - uVar39) * '\x06' & 0x3fU)) & 0x3f) +
                   (uVar41 - uVar39) * 4 << (pBVar13->size_bits_by_length[uVar41] & 0x3f)),
     local_158 <= uVar21)) {
    iVar45 = 0x1f;
    if ((uint)local_158 != 0) {
      for (; (uint)local_158 >> iVar45 == 0; iVar45 = iVar45 + -1) {
      }
    }
    uVar41 = (uVar39 * 0x87 - (ulong)(uint)(iVar45 * 0x1e)) + 0x780;
    if (0x7e3 < uVar41) {
      iVar45 = (uint)bVar26 - (int)uVar39;
      pHVar12->dict_num_matches = pHVar12->dict_num_matches + 1;
      goto LAB_01be8627;
    }
  }
LAB_01be84b8:
  puVar10[lVar33] = uVar19;
LAB_01be8c52:
  uVar46 = uVar46 + 1;
  position = uVar37 + 1;
  if (local_120 < position) {
    if ((uint)((int)lVar43 * 4) + local_120 < position) {
      uVar36 = uVar37 + 0x11;
      if (uVar6 <= uVar37 + 0x11) {
        uVar36 = uVar6;
      }
      for (; position < uVar36; position = position + 4) {
        puVar10[(uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                              0x7bd3579bd3000000) >> 0x2f) + ((uint)position & 0x18) & 0x1ffff] =
             (uint)position;
        uVar46 = uVar46 + 4;
      }
    }
    else {
      uVar36 = uVar37 + 9;
      if (uVar6 <= uVar37 + 9) {
        uVar36 = uVar6;
      }
      for (; position < uVar36; position = position + 2) {
        puVar10[(uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                              0x7bd3579bd3000000) >> 0x2f) + ((uint)position & 0x18) & 0x1ffff] =
             (uint)position;
        uVar46 = uVar46 + 2;
      }
    }
  }
LAB_01be9093:
  uVar37 = position;
  if (uVar2 <= position + 8) goto LAB_01be90f2;
  goto LAB_01be812b;
code_r0x01be8780:
  lVar38 = lVar38 + 8;
  lVar40 = lVar33 + lVar24;
  lVar24 = lVar24 + -8;
  if (lVar40 - 8U < 8) goto code_r0x01be8796;
  goto LAB_01be8773;
code_r0x01be8796:
  puVar23 = puVar27 + -lVar24;
  puVar49 = (ulong *)((long)puVar3 - lVar24);
  uVar29 = lVar24 + lVar33;
LAB_01be87aa:
  if (uVar29 != 0) {
    uVar30 = 0;
    do {
      uVar31 = uVar30;
      if (puVar23[uVar30] != *(uint8_t *)((long)puVar49 + uVar30)) break;
      uVar30 = uVar30 + 1;
      uVar31 = uVar29;
    } while (uVar29 != uVar30);
    puVar23 = puVar23 + uVar31;
  }
  uVar29 = (long)puVar23 - (long)puVar27;
LAB_01be8807:
  if ((uVar29 < 4) || (uVar30 = uVar29 * 0x87 + 0x78f, uVar30 < 0x7e5)) {
    local_178 = 0;
  }
  else {
    uVar42 = *(uint8_t *)((long)puVar3 + uVar29);
    uVar44 = uVar29;
    local_188 = uVar30;
    local_178 = (long)iVar7;
  }
LAB_01be884d:
  pBVar11 = (params->dictionary).contextual.dict[local_16c];
  uVar19 = (uint)((ulong)(*(long *)(ringbuffer + (uVar41 & ringbuffer_mask)) * 0x7bd3579bd3000000)
                 >> 0x2f);
  lVar40 = 0;
  lVar38 = 0;
  lVar24 = 1;
  do {
    auStack_58[lVar40] = lVar38 * 8 + (ulong)uVar19 & 0x1ffff;
    auStack_58[lVar40 + 1] = lVar24 * 8 + (ulong)uVar19 & 0x1ffff;
    lVar40 = lVar40 + 2;
    lVar38 = lVar38 + 2;
    lVar24 = lVar24 + 2;
  } while (lVar40 != 4);
  lVar38 = *(long *)((long)auStack_58 + (ulong)((uint)uVar41 & 0x18));
  lVar24 = 0;
LAB_01be88cc:
  uVar19 = puVar10[auStack_58[lVar24]];
  puVar27 = ringbuffer + (uVar17 & uVar19);
  if (((uVar42 == puVar27[uVar44]) && (uVar41 != uVar19)) &&
     (uVar29 = uVar41 - uVar19, uVar29 <= uVar22)) {
    puVar49 = puVar3;
    puVar23 = puVar27;
    uVar30 = uVar47;
    if (7 < uVar47) {
      lVar40 = 0;
      lVar50 = 0;
LAB_01be891a:
      if (*(ulong *)((long)puVar3 + lVar40) == *(ulong *)(puVar27 + lVar40)) goto code_r0x01be8927;
      uVar31 = *(ulong *)(puVar27 + lVar40) ^ *(ulong *)((long)puVar3 + lVar40);
      uVar30 = 0;
      if (uVar31 != 0) {
        for (; (uVar31 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
        }
      }
      uVar30 = (uVar30 >> 3 & 0x1fffffff) - lVar50;
      goto LAB_01be89a2;
    }
    goto LAB_01be8951;
  }
  goto LAB_01be89d6;
code_r0x01be8927:
  lVar40 = lVar40 + 8;
  lVar4 = lVar33 + lVar50;
  lVar50 = lVar50 + -8;
  if (lVar4 - 8U < 8) goto code_r0x01be893d;
  goto LAB_01be891a;
code_r0x01be893d:
  puVar23 = puVar27 + -lVar50;
  puVar49 = (ulong *)((long)puVar3 - lVar50);
  uVar30 = lVar50 + lVar33;
LAB_01be8951:
  if (uVar30 != 0) {
    uVar31 = 0;
    do {
      uVar15 = uVar31;
      if (puVar23[uVar31] != *(uint8_t *)((long)puVar49 + uVar31)) break;
      uVar31 = uVar31 + 1;
      uVar15 = uVar30;
    } while (uVar30 != uVar31);
    puVar23 = puVar23 + uVar15;
  }
  uVar30 = (long)puVar23 - (long)puVar27;
LAB_01be89a2:
  if (3 < uVar30) {
    iVar32 = 0x1f;
    if ((uint)uVar29 != 0) {
      for (; (uint)uVar29 >> iVar32 == 0; iVar32 = iVar32 + -1) {
      }
    }
    uVar31 = (ulong)(iVar32 * -0x1e + 0x780) + uVar30 * 0x87;
    if (local_188 < uVar31) {
      uVar42 = *(uint8_t *)((long)puVar3 + uVar30);
      uVar44 = uVar30;
      local_188 = uVar31;
      local_178 = uVar29;
    }
  }
LAB_01be89d6:
  lVar24 = lVar24 + 1;
  if (lVar24 == 4) goto code_r0x01be89e9;
  goto LAB_01be88cc;
code_r0x01be89e9:
  iVar32 = 0;
  if (local_188 != 0x7e4) goto LAB_01be8a65;
  pHVar12 = (hasher->privat)._H2.common;
  local_188 = 0x7e4;
  if (pHVar12->dict_num_matches < pHVar12->dict_num_lookups >> 7) goto LAB_01be8a65;
  uVar22 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x12);
  puVar27 = pBVar11->hash_table_lengths;
  pHVar12->dict_num_lookups = pHVar12->dict_num_lookups + 1;
  bVar26 = puVar27[uVar22 * 2];
  uVar29 = (ulong)bVar26;
  if ((uVar29 == 0) || (uVar47 < uVar29)) goto LAB_01be8a65;
  pBVar13 = pBVar11->words;
  puVar25 = (ulong *)(pBVar13->data +
                     (ulong)pBVar13->offsets_by_length[uVar29] +
                     pBVar11->hash_table_words[uVar22 * 2] * uVar29);
  uVar30 = uVar29;
  puVar49 = puVar3;
  if (7 < bVar26) {
    lVar24 = 0;
LAB_01be8b16:
    if (*puVar25 == *puVar49) goto code_r0x01be8b21;
    uVar31 = *puVar49 ^ *puVar25;
    uVar30 = 0;
    if (uVar31 != 0) {
      for (; (uVar31 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
      }
    }
    uVar30 = (uVar30 >> 3 & 0x1fffffff) - lVar24;
    goto LAB_01be8b80;
  }
LAB_01be8b48:
  uVar31 = 0;
  do {
    uVar15 = uVar31;
    if (*(char *)((long)puVar49 + uVar31) != *(char *)((long)puVar25 + uVar31)) break;
    uVar31 = uVar31 + 1;
    uVar15 = uVar30;
  } while (uVar30 != uVar31);
  puVar49 = (ulong *)((long)puVar49 + uVar15);
  goto LAB_01be8b6d;
code_r0x01be8b21:
  puVar25 = puVar25 + 1;
  puVar49 = puVar49 + 1;
  lVar40 = uVar29 + lVar24;
  lVar24 = lVar24 + -8;
  if (lVar40 - 8U < 8) goto code_r0x01be8b3b;
  goto LAB_01be8b16;
code_r0x01be8b3b:
  uVar30 = lVar24 + uVar29;
  if (lVar24 + uVar29 != 0) goto LAB_01be8b48;
LAB_01be8b6d:
  uVar30 = (long)puVar49 - (long)puVar3;
LAB_01be8b80:
  if (((uVar30 != 0) && (uVar29 < pBVar11->cutoffTransformsCount + uVar30)) &&
     (uVar22 = (ulong)pBVar11->hash_table_words[uVar22 * 2] + lVar1 + local_f8 +
               ((ulong)((uint)(pBVar11->cutoffTransforms >>
                              ((char)(uVar29 - uVar30) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar29 - uVar30) * 4 << (pBVar13->size_bits_by_length[uVar29] & 0x3f)),
     uVar22 <= uVar21)) {
    iVar14 = 0x1f;
    if ((uint)uVar22 != 0) {
      for (; (uint)uVar22 >> iVar14 == 0; iVar14 = iVar14 + -1) {
      }
    }
    uVar29 = (uVar30 * 0x87 - (ulong)(uint)(iVar14 * 0x1e)) + 0x780;
    if (0x7e3 < uVar29) {
      iVar32 = (uint)bVar26 - (int)uVar30;
      pHVar12->dict_num_matches = pHVar12->dict_num_matches + 1;
      uVar44 = uVar30;
      local_188 = uVar29;
      local_178 = uVar22;
    }
  }
LAB_01be8a65:
  puVar10[lVar38] = (uint)uVar41;
  if (local_188 < local_120 + 0xaf) {
    uVar41 = uVar37;
    uVar22 = uVar36;
    uVar44 = uVar39;
    local_f8 = uVar37 + sVar8;
    iVar32 = iVar45;
    if (uVar48 <= uVar37 + sVar8) {
      local_f8 = uVar48;
    }
    goto LAB_01be8d98;
  }
  uVar22 = uVar46 + 4;
  local_158 = local_178;
  if (local_10c == 3) goto LAB_01be8d98;
  uVar22 = uVar36 + 1;
  local_10c = local_10c + 1;
  uVar29 = uVar37 + 9;
  lVar33 = lVar33 + -1;
  local_120 = local_188;
  uVar39 = uVar44;
  uVar37 = uVar41;
  uVar36 = uVar22;
  iVar45 = iVar32;
  if (uVar2 <= uVar29) goto LAB_01be8d98;
  goto LAB_01be8688;
LAB_01be8d98:
  local_f8 = local_f8 + sVar9;
  if (local_f8 < local_158) {
LAB_01be8dc1:
    uVar46 = local_158 + 0xf;
LAB_01be8dc5:
    if ((local_158 <= local_f8) && (uVar46 != 0)) {
      dist_cache[3] = dist_cache[2];
      *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
      *dist_cache = (int)local_158;
    }
  }
  else {
    if (local_158 != (long)*dist_cache) {
      uVar46 = 1;
      if (local_158 != (long)dist_cache[1]) {
        uVar46 = (local_158 + 3) - (long)*dist_cache;
        if (uVar46 < 7) {
          bVar26 = (byte)((int)uVar46 << 2);
          uVar19 = 0x9750468;
        }
        else {
          uVar46 = (local_158 + 3) - (long)dist_cache[1];
          if (6 < uVar46) {
            uVar46 = 2;
            if ((local_158 != (long)dist_cache[2]) && (uVar46 = 3, local_158 != (long)dist_cache[3])
               ) goto LAB_01be8dc1;
            goto LAB_01be8dc5;
          }
          bVar26 = (byte)((int)uVar46 << 2);
          uVar19 = 0xfdb1ace;
        }
        uVar46 = (ulong)(uVar19 >> (bVar26 & 0x1f) & 0xf);
      }
      goto LAB_01be8dc5;
    }
    uVar46 = 0;
  }
  local_140->insert_len_ = (uint32_t)uVar22;
  local_140->copy_len_ = iVar32 << 0x19 | (uint)uVar44;
  uVar36 = (ulong)(params->dist).num_direct_distance_codes;
  uVar37 = uVar36 + 0x10;
  uVar34 = 0;
  if (uVar37 <= uVar46) {
    uVar19 = (params->dist).distance_postfix_bits;
    bVar26 = (byte)uVar19;
    uVar36 = ((uVar46 - uVar36) + (4L << (bVar26 & 0x3f))) - 0x10;
    uVar20 = 0x1f;
    uVar35 = (uint)uVar36;
    if (uVar35 != 0) {
      for (; uVar35 >> uVar20 == 0; uVar20 = uVar20 - 1) {
      }
    }
    uVar20 = (uVar20 ^ 0xffffffe0) + 0x1f;
    uVar21 = (ulong)((uVar36 >> ((ulong)uVar20 & 0x3f) & 1) != 0);
    lVar33 = (ulong)uVar20 - (ulong)uVar19;
    uVar46 = (~(-1 << (bVar26 & 0x1f)) & uVar35) + uVar37 +
             (uVar21 + lVar33 * 2 + 0xfffe << (bVar26 & 0x3f)) | lVar33 * 0x400;
    uVar34 = (uint32_t)(uVar36 - (uVar21 + 2 << ((byte)uVar20 & 0x3f)) >> (bVar26 & 0x3f));
  }
  local_140->dist_prefix_ = (uint16_t)uVar46;
  local_140->dist_extra_ = uVar34;
  if (uVar22 < 6) {
    uVar37 = uVar22 & 0xffffffff;
  }
  else if (uVar22 < 0x82) {
    uVar19 = 0x1f;
    uVar20 = (uint)(uVar22 - 2);
    if (uVar20 != 0) {
      for (; uVar20 >> uVar19 == 0; uVar19 = uVar19 - 1) {
      }
    }
    uVar37 = (ulong)((int)(uVar22 - 2 >> ((char)(uVar19 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar19 ^ 0xffffffe0) * 2 + 0x40);
  }
  else if (uVar22 < 0x842) {
    uVar20 = (uint32_t)uVar22 - 0x42;
    uVar19 = 0x1f;
    if (uVar20 != 0) {
      for (; uVar20 >> uVar19 == 0; uVar19 = uVar19 - 1) {
      }
    }
    uVar37 = (ulong)((uVar19 ^ 0xffe0) + 0x2a);
  }
  else {
    uVar37 = 0x15;
    if (0x1841 < uVar22) {
      uVar37 = (ulong)(ushort)(0x17 - (uVar22 < 0x5842));
    }
  }
  uVar19 = iVar32 + (uint)uVar44;
  if (uVar19 < 10) {
    uVar20 = uVar19 - 2;
  }
  else if (uVar19 < 0x86) {
    uVar19 = uVar19 - 6;
    uVar20 = 0x1f;
    if (uVar19 != 0) {
      for (; uVar19 >> uVar20 == 0; uVar20 = uVar20 - 1) {
      }
    }
    uVar20 = (uVar19 >> ((char)(uVar20 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar20 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar20 = 0x17;
    if (uVar19 < 0x846) {
      uVar20 = 0x1f;
      if (uVar19 - 0x46 != 0) {
        for (; uVar19 - 0x46 >> uVar20 == 0; uVar20 = uVar20 - 1) {
        }
      }
      uVar20 = (uVar20 ^ 0xffe0) + 0x2c;
    }
  }
  uVar16 = (ushort)uVar20;
  uVar18 = (uVar16 & 7) + ((ushort)uVar37 & 7) * 8;
  if ((((uVar46 & 0x3ff) == 0) && ((ushort)uVar37 < 8)) && (uVar16 < 0x10)) {
    if (7 < uVar16) {
      uVar18 = uVar18 | 0x40;
    }
  }
  else {
    iVar45 = (int)((uVar37 & 0xffff) >> 3) * 3 + ((uVar20 & 0xffff) >> 3);
    uVar18 = uVar18 + ((ushort)(0x520d40 >> ((char)iVar45 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar45 * 0x40 + 0x40;
  }
  local_140->cmd_prefix_ = uVar18;
  *num_literals = *num_literals + uVar22;
  position = uVar44 + uVar41;
  uVar46 = sVar28;
  if (position < sVar28) {
    uVar46 = position;
  }
  uVar37 = uVar41 + 2;
  if (local_158 < uVar44 >> 2) {
    uVar36 = position + local_158 * -4;
    if (uVar36 < uVar37) {
      uVar36 = uVar37;
    }
    uVar37 = uVar36;
    if (uVar46 < uVar36) {
      uVar37 = uVar46;
    }
  }
  local_120 = uVar41 + lVar43 + uVar44 * 2;
  local_140 = local_140 + 1;
  if (uVar37 < uVar46) {
    do {
      puVar10[(uint)((ulong)(*(long *)(ringbuffer + (uVar37 & ringbuffer_mask)) * 0x7bd3579bd3000000
                            ) >> 0x2f) + ((uint)uVar37 & 0x18) & 0x1ffff] = (uint)uVar37;
      uVar37 = uVar37 + 1;
    } while (uVar46 != uVar37);
  }
  uVar46 = 0;
  goto LAB_01be9093;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}